

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.h
# Opt level: O1

vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
* wasm::DFA::refinePartitions<wasm::HeapType>
            (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
            *partitions)

{
  pointer pvVar1;
  pointer pSVar2;
  key_type *pkVar3;
  pointer puVar4;
  pointer pvVar5;
  iterator iVar6;
  HeapType *__args;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  pointer pSVar7;
  pointer pvVar8;
  key_type *__k;
  undefined1 auVar9 [8];
  pointer puVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar11;
  undefined1 local_f8 [8];
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  indices;
  undefined1 auStack_b8 [8];
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  indexPartitions;
  void *pvStack_98;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> values;
  undefined1 auStack_68 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  indexResults;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *results;
  vector<unsigned_long,_std::allocator<unsigned_long>_> succIndices;
  
  local_f8 = (undefined1  [8])&indices._M_h._M_rehash_policy._M_next_resize;
  indices._M_h._M_buckets = (__buckets_ptr)0x1;
  indices._M_h._M_bucket_count = 0;
  indices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indices._M_h._M_element_count._0_4_ = 0x3f800000;
  indices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  indices._M_h._M_rehash_policy._4_4_ = 0;
  indices._M_h._M_rehash_policy._M_next_resize = 0;
  pvStack_98 = (void *)0x0;
  values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar8 = (partitions->
           super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (partitions->
           super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  indexResults.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  if (pvVar8 != pvVar1) {
    do {
      pSVar2 = (pvVar8->
               super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar7 = (pvVar8->
                    super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar2;
          pSVar7 = pSVar7 + 1) {
        auStack_b8 = (undefined1  [8])(pSVar7->val).id;
        indexPartitions.
        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)indices._M_h._M_before_begin._M_nxt;
        pVar11 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_f8,auStack_b8);
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted && \"unexpected repeated value\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/dfa_minimization.h"
                        ,0x3b,
                        "std::vector<std::vector<T>> wasm::DFA::refinePartitions(const std::vector<std::vector<State<T>>> &) [T = wasm::HeapType]"
                       );
        }
        if (values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&pvStack_98,
                     (iterator)
                     values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,&pSVar7->val);
        }
        else {
          (values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (pSVar7->val).id;
          values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != pvVar1);
  }
  auStack_b8 = (undefined1  [8])0x0;
  indexPartitions.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indexPartitions.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::reserve((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)auStack_b8,
            ((long)(partitions->
                   super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(partitions->
                   super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar8 = (partitions->
           super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  indices._M_h._M_single_bucket =
       (__node_base_ptr)
       (partitions->
       super__Vector_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 != (pointer)indices._M_h._M_single_bucket) {
    do {
      auStack_68 = (undefined1  [8])0x0;
      indexResults.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      indexResults.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::reserve((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)auStack_68,
                (long)(pvVar8->
                      super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar8->
                      super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5);
      pSVar2 = (pvVar8->
               super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar7 = (pvVar8->
                    super__Vector_base<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar2;
          pSVar7 = pSVar7 + 1) {
        results = (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   *)0x0;
        succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&results,
                   (long)(pSVar7->succs).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pSVar7->succs).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3);
        pkVar3 = (pSVar7->succs).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__k = (pSVar7->succs).
                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                   super__Vector_impl_data._M_start; __k != pkVar3; __k = __k + 1) {
          iVar6 = std::
                  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_f8,__k);
          if (iVar6.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
              _M_cur == (__node_type *)0x0) {
            __assert_fail("it != indices.end() && \"unknown successor value\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/dfa_minimization.h"
                          ,0x4b,
                          "std::vector<std::vector<T>> wasm::DFA::refinePartitions(const std::vector<std::vector<State<T>>> &) [T = wasm::HeapType]"
                         );
          }
          if (succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&results,
                       (iterator)
                       succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (unsigned_long *)
                       ((long)iVar6.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                              ._M_cur + 0x10));
          }
          else {
            *succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start =
                 *(unsigned_long *)
                  ((long)iVar6.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                         ._M_cur + 0x10);
            succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)auStack_68,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&results);
        if (results !=
            (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *)0x0) {
          operator_delete(results,(long)succIndices.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)results);
        }
      }
      std::
      vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
      ::
      emplace_back<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                ((vector<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::allocator<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                  *)auStack_b8,
                 (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)auStack_68);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)auStack_68);
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != (pointer)indices._M_h._M_single_bucket);
  }
  Internal::refinePartitionsImpl
            ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)auStack_68,(InputGraph *)auStack_b8);
  ((indexResults.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  ((indexResults.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ((indexResults.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::reserve((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *)indexResults.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
            ((long)indexResults.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >> 3) *
            -0x5555555555555555);
  pvVar5 = indexResults.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_68 !=
      (undefined1  [8])
      indexResults.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar9 = auStack_68;
    do {
      results = (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)0x0;
      succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&results,
                 (long)(((pointer)auVar9)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(((pointer)auVar9)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      puVar4 = (((pointer)auVar9)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (puVar10 = (((pointer)auVar9)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; puVar10 != puVar4; puVar10 = puVar10 + 1) {
        __args = (HeapType *)(*puVar10 * 8 + (long)pvStack_98);
        if (succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&results,
                     (iterator)
                     succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          *succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start = __args->id;
          succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               succIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start + 1;
        }
      }
      std::
      vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
      ::emplace_back<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                  *)indexResults.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&results);
      if (results !=
          (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
           *)0x0) {
        operator_delete(results,(long)succIndices.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)results);
      }
      auVar9 = (undefined1  [8])((long)auVar9 + 0x18);
    } while (auVar9 != (undefined1  [8])pvVar5);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)auStack_68);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)auStack_b8);
  if (pvStack_98 != (void *)0x0) {
    operator_delete(pvStack_98,
                    (long)values.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvStack_98);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_f8);
  return (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          *)indexResults.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

std::vector<std::vector<T>>
refinePartitions(const std::vector<std::vector<State<T>>>& partitions) {
  // Map values to indices and vice versa.
  std::unordered_map<T, size_t> indices;
  std::vector<T> values;
  for (const auto& partition : partitions) {
    for (const auto& state : partition) {
      [[maybe_unused]] bool inserted =
        indices.insert({state.val, indices.size()}).second;
      assert(inserted && "unexpected repeated value");
      values.push_back(state.val);
    }
  }

  // Create a copy of the DFA that uses indices instead of the original values.
  std::vector<std::vector<std::vector<size_t>>> indexPartitions;
  indexPartitions.reserve(partitions.size());
  for (const auto& partition : partitions) {
    std::vector<std::vector<size_t>> indexPartition;
    indexPartition.reserve(partition.size());
    for (const auto& state : partition) {
      std::vector<size_t> succIndices;
      succIndices.reserve(state.succs.size());
      for (const auto& succ : state.succs) {
        auto it = indices.find(succ);
        assert(it != indices.end() && "unknown successor value");
        succIndices.push_back(it->second);
      }
      indexPartition.emplace_back(std::move(succIndices));
    }
    indexPartitions.emplace_back(std::move(indexPartition));
  }

  // Refine the partitions.
  auto indexResults = Internal::refinePartitionsImpl(indexPartitions);

  // Map the refined partitions of indices back to values.
  std::vector<std::vector<T>> results;
  results.reserve(indexResults.size());
  for (const auto& indexPartition : indexResults) {
    std::vector<T> partition;
    partition.reserve(indexPartition.size());
    for (size_t index : indexPartition) {
      partition.push_back(values[index]);
    }
    results.emplace_back(std::move(partition));
  }

  return results;
}